

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cycle.cpp
# Opt level: O0

value_store * __thiscall mpt::cycle::values(cycle *this,uint dim,int nc)

{
  int *piVar1;
  stage *this_00;
  stage *st;
  int nc_local;
  uint dim_local;
  cycle *this_local;
  
  if ((this->_max_dimensions == '\0') || (dim < this->_max_dimensions)) {
    st._0_4_ = nc;
    if (nc < 0) {
      st._0_4_ = (uint)this->_act;
    }
    this_00 = unique_array<mpt::cycle::stage>::get
                        (&(this->_stages).super_unique_array<mpt::cycle::stage>,(long)(int)(uint)st)
    ;
    if (this_00 == (stage *)0x0) {
      this_local = (cycle *)0x0;
    }
    else {
      this_local = (cycle *)rawdata_stage::values(&this_00->super_rawdata_stage,(ulong)dim);
    }
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    this_local = (cycle *)0x0;
  }
  return (value_store *)this_local;
}

Assistant:

const MPT_STRUCT(value_store) *cycle::values(unsigned dim, int nc) const
{
	if (_max_dimensions && dim >= _max_dimensions) {
		errno = EINVAL;
		return 0;
	}
	if (nc < 0) {
		nc = _act;
	}
	stage *st;
	if (!(st = _stages.get(nc))) {
		return 0;
	}
	return st->rawdata_stage::values(dim);
}